

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O0

int UpnpRegisterRootDevice3
              (char *DescUrl,Upnp_FunPtr Fun,void *Cookie,UpnpDevice_Handle *Hnd,int AddressFamily)

{
  int iVar1;
  int AddressFamily_local;
  UpnpDevice_Handle *Hnd_local;
  void *Cookie_local;
  Upnp_FunPtr Fun_local;
  char *DescUrl_local;
  
  UpnpPrintf(UPNP_ALL,API,".upnp/src/api/upnpapi.c",0x4f0,"Inside UpnpRegisterRootDevice3\n");
  iVar1 = UpnpRegisterRootDevice4(DescUrl,Fun,Cookie,Hnd,AddressFamily,(char *)0x0);
  return iVar1;
}

Assistant:

int UpnpRegisterRootDevice3(const char *DescUrl,
	Upnp_FunPtr Fun,
	const void *Cookie,
	UpnpDevice_Handle *Hnd,
	int AddressFamily)
{
	UpnpPrintf(UPNP_ALL,
		API,
		__FILE__,
		__LINE__,
		"Inside UpnpRegisterRootDevice3\n");
	return UpnpRegisterRootDevice4(
		DescUrl, Fun, Cookie, Hnd, AddressFamily, NULL);
}